

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS
ref_metric_sub_tri_complexity
          (REF_INT n0,REF_INT n1,REF_INT n2,REF_INT *nodes,REF_DBL *metric,REF_DBL *complexity,
          REF_NODE ref_node)

{
  uint uVar1;
  undefined4 in_register_00000014;
  REF_INT *pRVar2;
  undefined8 uVar3;
  char *pcVar4;
  long lVar5;
  double dVar6;
  REF_DBL volume;
  REF_INT tri_nodes [3];
  double local_50;
  double local_48;
  REF_INT local_3c [3];
  
  pRVar2 = (REF_INT *)CONCAT44(in_register_00000014,n2);
  local_3c[0] = *pRVar2;
  local_3c[1] = pRVar2[(uint)n0];
  local_3c[2] = pRVar2[(uint)n1];
  uVar1 = ref_node_tri_area((REF_NODE)complexity,local_3c,&local_48);
  if (uVar1 == 0) {
    lVar5 = 0;
    do {
      if (*(int *)((long)complexity[10] + 4) ==
          *(int *)((long)complexity[5] + (long)local_3c[lVar5] * 4)) {
        uVar1 = ref_matrix_det_m((REF_DBL *)(nodes + (long)local_3c[lVar5] * 0xc),&local_50);
        if (uVar1 != 0) {
          pcVar4 = "det";
          uVar3 = 0x756;
          goto LAB_001a578d;
        }
        if (0.0 < local_50) {
          if (local_50 < 0.0) {
            dVar6 = sqrt(local_50);
          }
          else {
            dVar6 = SQRT(local_50);
          }
          *metric = (dVar6 * local_48) / 3.0 + *metric;
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    uVar1 = 0;
  }
  else {
    pcVar4 = "vol";
    uVar3 = 0x753;
LAB_001a578d:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar3,
           "ref_metric_sub_tri_complexity",(ulong)uVar1,pcVar4);
  }
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_metric_sub_tri_complexity(
    REF_INT n0, REF_INT n1, REF_INT n2, REF_INT *nodes, REF_DBL *metric,
    REF_DBL *complexity, REF_NODE ref_node) {
  REF_DBL volume, det;
  REF_INT cell_node;
  REF_INT tri_nodes[3];
  tri_nodes[0] = nodes[n0];
  tri_nodes[1] = nodes[n1];
  tri_nodes[2] = nodes[n2];
  RSS(ref_node_tri_area(ref_node, tri_nodes, &volume), "vol");
  for (cell_node = 0; cell_node < 3; cell_node++) {
    if (ref_node_owned(ref_node, tri_nodes[cell_node])) {
      RSS(ref_matrix_det_m(&(metric[6 * tri_nodes[cell_node]]), &det), "det");
      if (det > 0.0) {
        (*complexity) += sqrt(det) * volume / 3.0;
      }
    }
  }

  return REF_SUCCESS;
}